

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_setup(mbedtls_ssl_context *ssl,mbedtls_ssl_config *conf)

{
  int iVar1;
  uchar *__ptr;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  
  ssl->conf = conf;
  __ptr = (uchar *)calloc(1,0x414d);
  ssl->in_buf = __ptr;
  if (__ptr != (uchar *)0x0) {
    puVar2 = (uchar *)calloc(1,0x414d);
    ssl->out_buf = puVar2;
    if (puVar2 != (uchar *)0x0) {
      if ((conf->field_0x174 & 2) == 0) {
        ssl->out_ctr = puVar2;
        puVar3 = __ptr;
        puVar4 = __ptr + 8;
        puVar5 = puVar2 + 8;
      }
      else {
        ssl->out_ctr = puVar2 + 3;
        puVar3 = __ptr + 3;
        puVar4 = __ptr;
        puVar5 = puVar2;
      }
      ssl->out_hdr = puVar5;
      ssl->out_len = puVar2 + 0xb;
      ssl->out_iv = puVar2 + 0xd;
      ssl->out_msg = puVar2 + 0xd;
      ssl->in_ctr = puVar3;
      ssl->in_hdr = puVar4;
      ssl->in_len = __ptr + 0xb;
      ssl->in_iv = __ptr + 0xd;
      ssl->in_msg = __ptr + 0xd;
      iVar1 = ssl_handshake_init(ssl);
      return iVar1;
    }
  }
  free(__ptr);
  ssl->in_buf = (uchar *)0x0;
  return -0x7f00;
}

Assistant:

int mbedtls_ssl_setup( mbedtls_ssl_context *ssl,
                       const mbedtls_ssl_config *conf )
{
    int ret;
    const size_t len = MBEDTLS_SSL_BUFFER_LEN;

    ssl->conf = conf;

    /*
     * Prepare base structures
     */
    if( ( ssl-> in_buf = mbedtls_calloc( 1, len ) ) == NULL ||
        ( ssl->out_buf = mbedtls_calloc( 1, len ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed", len ) );
        mbedtls_free( ssl->in_buf );
        ssl->in_buf = NULL;
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ssl->out_hdr = ssl->out_buf;
        ssl->out_ctr = ssl->out_buf +  3;
        ssl->out_len = ssl->out_buf + 11;
        ssl->out_iv  = ssl->out_buf + 13;
        ssl->out_msg = ssl->out_buf + 13;

        ssl->in_hdr = ssl->in_buf;
        ssl->in_ctr = ssl->in_buf +  3;
        ssl->in_len = ssl->in_buf + 11;
        ssl->in_iv  = ssl->in_buf + 13;
        ssl->in_msg = ssl->in_buf + 13;
    }
    else
#endif
    {
        ssl->out_ctr = ssl->out_buf;
        ssl->out_hdr = ssl->out_buf +  8;
        ssl->out_len = ssl->out_buf + 11;
        ssl->out_iv  = ssl->out_buf + 13;
        ssl->out_msg = ssl->out_buf + 13;

        ssl->in_ctr = ssl->in_buf;
        ssl->in_hdr = ssl->in_buf +  8;
        ssl->in_len = ssl->in_buf + 11;
        ssl->in_iv  = ssl->in_buf + 13;
        ssl->in_msg = ssl->in_buf + 13;
    }

    if( ( ret = ssl_handshake_init( ssl ) ) != 0 )
        return( ret );

    return( 0 );
}